

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

bool __thiscall
QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>::
insertIfNotContains(QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>
                    *this,pair<int,_int> k,function<bool_(void_*,_void_*)> *f)

{
  bool bVar1;
  long in_FS_OFFSET;
  QWriteLocker local_48;
  pair<int,_int> local_40;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.q_val = (quintptr)this;
  local_40 = k;
  QWriteLocker::relock(&local_48);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHash<std::pair<int,int>,std::function<bool(void*,void*)>>::
  tryEmplace_impl<std::pair<int,int>const&,std::function<bool(void*,void*)>const&>
            ((TryEmplaceResult *)local_38,
             (QHash<std::pair<int,int>,std::function<bool(void*,void*)>> *)(this + 8),&local_40,f);
  bVar1 = local_38[0x10];
  QWriteLocker::~QWriteLocker(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool insertIfNotContains(Key k, const T &f)
    {
        const QWriteLocker locker(&lock);
        auto r = map.tryEmplace(k, f);
        return r.inserted;
    }